

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

double mpack_tree_double(mpack_tree_parser_t *parser)

{
  double dVar1;
  anon_union_8_2_94730066 u;
  mpack_tree_parser_t *parser_local;
  
  dVar1 = (double)mpack_tree_u64(parser);
  return dVar1;
}

Assistant:

MPACK_STATIC_INLINE double mpack_tree_double(mpack_tree_parser_t* parser) {
    union {
        double d;
        uint64_t i;
    } u;
    u.i = mpack_tree_u64(parser);
    return u.d;
}